

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFastHuf.cpp
# Opt level: O0

void __thiscall Imf_2_5::FastHufDecoder::buildTables(FastHufDecoder *this,Int64 *base,Int64 *offset)

{
  ulong uVar1;
  InputExc *this_00;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar2;
  int minIdx;
  Int64 id;
  int codeLen;
  Int64 value;
  Int64 i_2;
  int i_1;
  int i;
  int local_44;
  uint local_34;
  ulong local_28;
  int local_20;
  int local_1c;
  
  for (local_1c = 0; local_1c < 0x3b; local_1c = local_1c + 1) {
    if (*(long *)(in_RSI + (long)local_1c * 8) == -1) {
      *(undefined8 *)(in_RDI + 0x18 + (long)local_1c * 8) = 0xffffffffffffffff;
    }
    else {
      *(long *)(in_RDI + 0x18 + (long)local_1c * 8) =
           *(long *)(in_RSI + (long)local_1c * 8) << (0x40U - (char)local_1c & 0x3f);
    }
  }
  *(long *)(in_RDI + 0x1f0) = *in_RDX - *(long *)(in_RDI + 0x18);
  for (local_20 = 1; local_20 < 0x3b; local_20 = local_20 + 1) {
    *(ulong *)(in_RDI + 0x1f0 + (long)local_20 * 8) =
         in_RDX[local_20] -
         (*(ulong *)(in_RDI + 0x18 + (long)local_20 * 8) >> (0x40U - (char)local_20 & 0x3f));
  }
  local_28 = 0;
  do {
    if (0xfff < local_28) {
      local_44 = 0xc;
      while( true ) {
        bVar2 = false;
        if (0 < local_44) {
          bVar2 = *(long *)(in_RDI + 0x18 + (long)local_44 * 8) == -1;
        }
        if (!bVar2) break;
        local_44 = local_44 + -1;
      }
      if (local_44 < 0) {
        *(undefined8 *)(in_RDI + 0x53c8) = 0xffffffffffffffff;
      }
      else {
        *(undefined8 *)(in_RDI + 0x53c8) = *(undefined8 *)(in_RDI + 0x18 + (long)local_44 * 8);
      }
      return;
    }
    *(undefined4 *)(in_RDI + 0x3c8 + local_28 * 4) = 0xffff;
    *(undefined1 *)(in_RDI + 0x43c8 + local_28) = 0;
    for (local_34 = (uint)*(byte *)(in_RDI + 8); (int)local_34 <= (int)(uint)*(byte *)(in_RDI + 9);
        local_34 = local_34 + 1) {
      if (*(ulong *)(in_RDI + 0x18 + (long)(int)local_34 * 8) <= local_28 << 0x34) {
        *(char *)(in_RDI + 0x43c8 + local_28) = (char)local_34;
        uVar1 = *(long *)(in_RDI + 0x1f0 + (long)(int)local_34 * 8) +
                ((local_28 << 0x34) >> (0x40U - (char)local_34 & 0x3f));
        if ((ulong)(long)*(int *)(in_RDI + 4) <= uVar1) {
          this_00 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(this_00,"Huffman decode error (Overrun).");
          __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
        }
        *(undefined4 *)(in_RDI + 0x3c8 + local_28 * 4) =
             *(undefined4 *)(*(long *)(in_RDI + 0x10) + uVar1 * 4);
        break;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void
FastHufDecoder::buildTables (Int64 *base, Int64 *offset)
{
    //
    // Build the 'left justified' base table, by shifting base left..
    //

    for (int i = 0; i <= MAX_CODE_LEN; ++i)
    {
        if (base[i] != 0xffffffffffffffffULL)
        {
            _ljBase[i] = base[i] << (64 - i);
        }
        else
        {
            //
            // Unused code length - insert dummy values
            //

            _ljBase[i] = 0xffffffffffffffffULL;
        }
    }

    //
    // Combine some terms into a big fat constant, which for
    // lack of a better term we'll call the 'left justified' 
    // offset table (because it serves the same function
    // as 'offset', when using the left justified base table.
    //

    _ljOffset[0] = offset[0] - _ljBase[0];
    for (int i = 1; i <= MAX_CODE_LEN; ++i)
        _ljOffset[i] = offset[i] - (_ljBase[i] >> (64 - i));

    //
    // Build the acceleration tables for the lookups of
    // short codes ( <= TABLE_LOOKUP_BITS long)
    //

    for (Int64 i = 0; i < 1 << TABLE_LOOKUP_BITS; ++i)
    {
        Int64 value = i << (64 - TABLE_LOOKUP_BITS);

        _tableSymbol[i]  = 0xffff;
        _tableCodeLen[i] = 0; 

        for (int codeLen = _minCodeLength; codeLen <= _maxCodeLength; ++codeLen)
        {
            if (_ljBase[codeLen] <= value)
            {
                _tableCodeLen[i] = codeLen;

                Int64 id = _ljOffset[codeLen] + (value >> (64 - codeLen));
                if (id < static_cast<Int64>(_numSymbols))
                {
                    _tableSymbol[i] = _idToSymbol[id];
                }
                else
                {
                    throw IEX_NAMESPACE::InputExc ("Huffman decode error "
                                                   "(Overrun).");
                }
                break;
            }
        }
    }

    //
    // Store the smallest value in the table that points to real data.
    // This should be the entry for the largest length that has 
    // valid data (in our case, non-dummy _ljBase)
    //

    int minIdx = TABLE_LOOKUP_BITS;

    while (minIdx > 0 && _ljBase[minIdx] == 0xffffffffffffffffULL)
        minIdx--;

    if (minIdx < 0)
    {
        //
        // Error, no codes with lengths 0-TABLE_LOOKUP_BITS used.
        // Set the min value such that the table is never tested.
        //

        _tableMin = 0xffffffffffffffffULL;
    }
    else
    {
        _tableMin = _ljBase[minIdx];
    }
}